

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  string *psVar1;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string currentBinDir;
  string currentSrcDir;
  allocator<char> local_69;
  string local_68;
  string local_48;
  char *local_28;
  size_t local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_CURRENT_SOURCE_DIR",(allocator<char> *)&local_68);
  psVar1 = (string *)GetDefinition(this,&local_48);
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_28,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_BINARY_DIR",&local_69);
  psVar1 = (string *)GetDefinition(this,&local_68);
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  InitializeFromParent(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_SOURCE_DIR",&local_69);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  value._M_str = (psVar1->_M_dataplus)._M_p;
  value._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_68,value);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_BINARY_DIR",&local_69);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  value_00._M_str = (psVar1->_M_dataplus)._M_p;
  value_00._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_68,value_00);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_SOURCE_DIR",&local_69);
  value_01._M_str = local_28;
  value_01._M_len = local_20;
  SetDefinition(this,&local_68,value_01);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_BINARY_DIR",&local_69);
  value_02._M_str = local_48._M_dataplus._M_p;
  value_02._M_len = local_48._M_string_length;
  SetDefinition(this,&local_68,value_02);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = *this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = *this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}